

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::TextFlow::Column::iterator::iterator(iterator *this,Column *column,size_t stringIndex)

{
  size_t stringIndex_local;
  Column *column_local;
  iterator *this_local;
  
  this->m_column = column;
  this->m_stringIndex = stringIndex;
  this->m_pos = 0;
  this->m_len = 0;
  this->m_end = 0;
  this->m_suffix = false;
  return;
}

Assistant:

iterator(Column const& column, size_t stringIndex)
			: m_column(column),
			m_stringIndex(stringIndex) {}